

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O1

CURLcode gzip_init_writer(Curl_easy *data,contenc_writer *writer)

{
  contenc_writer **strm;
  int iVar1;
  char *__s1;
  zlib_writer *zp;
  
  if (writer->downstream == (contenc_writer *)0x0) {
    return CURLE_WRITE_ERROR;
  }
  strm = &writer[1].downstream;
  writer[5].downstream = (contenc_writer *)zalloc_cb;
  writer[6].handler = (content_encoding *)zfree_cb;
  __s1 = cm_zlib_zlibVersion();
  iVar1 = strcmp(__s1,"1.2.0.4");
  if (iVar1 < 0) {
    iVar1 = cm_zlib_inflateInit2_((z_streamp)strm,-0xf,"1.2.12",0x70);
    if (iVar1 != 0) goto LAB_0052f270;
    writer[1].handler = (content_encoding *)0x800000001;
  }
  else {
    iVar1 = cm_zlib_inflateInit2_((z_streamp)strm,0x2f,"1.2.12",0x70);
    if (iVar1 != 0) {
LAB_0052f270:
      process_zlib_error(data,(z_stream *)strm);
      return CURLE_BAD_CONTENT_ENCODING;
    }
    *(undefined4 *)&writer[1].handler = 6;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode gzip_init_writer(struct Curl_easy *data,
                                 struct contenc_writer *writer)
{
  struct zlib_writer *zp = (struct zlib_writer *) writer;
  z_stream *z = &zp->z;     /* zlib state structure */

  if(!writer->downstream)
    return CURLE_WRITE_ERROR;

  /* Initialize zlib */
  z->zalloc = (alloc_func) zalloc_cb;
  z->zfree = (free_func) zfree_cb;

  if(strcmp(zlibVersion(), "1.2.0.4") >= 0) {
    /* zlib ver. >= 1.2.0.4 supports transparent gzip decompressing */
    if(inflateInit2(z, MAX_WBITS + 32) != Z_OK) {
      return process_zlib_error(data, z);
    }
    zp->zlib_init = ZLIB_INIT_GZIP; /* Transparent gzip decompress state */
  }
  else {
    /* we must parse the gzip header and trailer ourselves */
    if(inflateInit2(z, -MAX_WBITS) != Z_OK) {
      return process_zlib_error(data, z);
    }
    zp->trailerlen = 8; /* A CRC-32 and a 32-bit input size (RFC 1952, 2.2) */
    zp->zlib_init = ZLIB_INIT; /* Initial call state */
  }

  return CURLE_OK;
}